

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-mpi.c
# Opt level: O2

int big_block_mpi_grow_simple(BigBlock *bb,int Nfile_grow,size_t size_grow,MPI_Comm comm)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  size_t *fsize_grow;
  size_t asStack_40 [2];
  undefined1 local_2c [8];
  int rank;
  
  lVar1 = -((ulong)(uint)Nfile_grow * 8 + 0xf & 0xfffffffffffffff0);
  fsize_grow = (size_t *)((long)asStack_40 + lVar1 + 8);
  uVar4 = 0;
  if (0 < Nfile_grow) {
    uVar4 = (ulong)(uint)Nfile_grow;
  }
  uVar3 = 0;
  for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    fsize_grow[uVar5] =
         (size_grow + uVar3) / (ulong)(long)Nfile_grow - uVar3 / (ulong)(long)Nfile_grow;
    uVar3 = size_grow + uVar3;
  }
  *(undefined8 *)((long)asStack_40 + lVar1) = 0x1049b2;
  MPI_Comm_rank(comm,local_2c);
  *(undefined8 *)((long)asStack_40 + lVar1) = 0x1049c3;
  iVar2 = big_block_mpi_grow(bb,Nfile_grow,fsize_grow,comm);
  return iVar2;
}

Assistant:

int
big_block_mpi_grow_simple(BigBlock * bb, int Nfile_grow, size_t size_grow, MPI_Comm comm)
{
    size_t fsize[Nfile_grow];
    int i;
    for(i = 0; i < Nfile_grow; i ++) {
        fsize[i] = size_grow * (i + 1) / Nfile_grow
                 - size_grow * (i) / Nfile_grow;
    }
    int rank;
    MPI_Comm_rank(comm, &rank);

    return big_block_mpi_grow(bb, Nfile_grow, fsize, comm);
}